

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEAngle.cpp
# Opt level: O0

void __thiscall
CEAngle::SetAngle(CEAngle *this,vector<double,_std::allocator<double>_> *angle_vec,
                 CEAngleType *angle_type)

{
  undefined8 uVar1;
  int *in_RDX;
  vector<double,_std::allocator<double>_> *in_stack_000001b8;
  CEAngle *in_stack_000001c0;
  allocator local_71;
  string local_70 [48];
  string *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  invalid_value *in_stack_ffffffffffffffd0;
  
  if (*in_RDX == 2) {
    SetAngle_HmsVect(in_stack_000001c0,in_stack_000001b8);
  }
  else {
    if (*in_RDX != 3) {
      uVar1 = __cxa_allocate_exception(0xa8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffc8,
                 "CEAngle::SetAngle(const std::vector<double>&, const CEAngleType&)",
                 (allocator *)&stack0xffffffffffffffc7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"[ERROR] Unknown angle type",&local_71);
      CEException::invalid_value::invalid_value
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      __cxa_throw(uVar1,&CEException::invalid_value::typeinfo,
                  CEException::invalid_value::~invalid_value);
    }
    SetAngle_DmsVect(in_stack_000001c0,in_stack_000001b8);
  }
  return;
}

Assistant:

void CEAngle::SetAngle(const std::vector<double>& angle_vec,
                       const CEAngleType&         angle_type)
{
    // Hours minutes seconds
    if (angle_type == CEAngleType::HMS) {
        SetAngle_HmsVect(angle_vec);
    } 
    // Degrees arcmins arcseconds
    else if (angle_type == CEAngleType::DMS) {
        SetAngle_DmsVect(angle_vec);
    }
    // Otherwise, all done
    else {
        throw CEException::invalid_value(
            "CEAngle::SetAngle(const std::vector<double>&, const CEAngleType&)",
            "[ERROR] Unknown angle type");
    }
}